

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

int32_t safe_sprintf_s(char **buf,size_t *buf_size,char *fmt,...)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  char *in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  vw_exception *in_R9;
  stringstream __msg;
  int32_t len;
  va_list args;
  undefined1 local_2b8 [16];
  string *in_stack_fffffffffffffd58;
  int plineNumber;
  stringstream local_1c8 [16];
  stringstream local_1b8 [192];
  size_t in_stack_ffffffffffffff08;
  size_t *in_stack_ffffffffffffff10;
  char **in_stack_ffffffffffffff18;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  size_t *local_10;
  undefined8 *local_8;
  
  plineNumber = (int)((ulong)in_RCX >> 0x20);
  local_28 = local_2b8;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = vsnprintf((char *)*in_RDI,*in_RSI,in_RDX,&local_38);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<((ostream *)(local_1c8 + 0x10),"Encoding error.");
    uVar3 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_R9,in_R8,plineNumber,in_stack_fffffffffffffd58);
    __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  bVar1 = resize_buf_if_needed
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    local_28 = local_2b8;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    vsnprintf((char *)*local_8,*local_10,local_18,&local_38);
  }
  return iVar2;
}

Assistant:

int32_t safe_sprintf_s(char*& buf, size_t& buf_size, const char* fmt, ...)
{
  va_list args;
  va_start(args, fmt);
  int32_t len = vsprintf_s(buf, buf_size, fmt, args);
  va_end(args);
  if (len < 0)
    THROW("Encoding error.");
  if (resize_buf_if_needed(buf, buf_size, len + 1))
  {
    va_start(args, fmt);
    vsprintf_s(buf, buf_size, fmt, args);
    va_end(args);
  }

  return len;
}